

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifnob(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int in_ESI;
  long in_RDI;
  voccxdef *voc;
  objnum cls;
  int j;
  int i;
  objnum obj;
  vocidef **v;
  vocidef ***vpg;
  objnum prv;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  voccxdef *voc_00;
  undefined2 in_stack_ffffffffffffffd0;
  ushort uVar6;
  int local_28;
  vocidef **local_20;
  vocidef ***local_18;
  
  voc_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffbc);
  }
  uVar1 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  uVar3 = (uint)uVar1;
  if (in_ESI == 1) {
    uVar6 = 0xffff;
  }
  else {
    if (in_ESI != 2) {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
             );
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x02') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
             );
    }
    uVar6 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    in_stack_ffffffffffffffc0 = (uint)uVar6;
  }
  local_28 = (int)(uint)uVar1 >> 8;
  local_18 = voc_00->voccxinh + local_28;
  uVar4 = uVar1 & 0xff;
  local_20 = *local_18 + (int)uVar4;
LAB_0026a57d:
  do {
    uVar4 = uVar4 + 1;
    local_20 = local_20 + 1;
    if (uVar4 == 0x100) {
      uVar4 = 0;
      local_28 = local_28 + 1;
      local_18 = local_18 + 1;
      if (*local_18 == (vocidef **)0x0) {
        uVar4 = 0xff;
        goto LAB_0026a57d;
      }
      local_20 = *local_18;
    }
    if (0x7f < local_28) {
      runpnil((runcxdef *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
      return;
    }
    if (((*local_20 != (vocidef *)0x0) && ((((*local_20)->vociu).vocius.vociusflg & 1) == 0)) &&
       ((uVar6 == 0xffff ||
        (iVar5 = bifinh(voc_00,(vocidef *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                        (objnum)((uint)in_stack_ffffffffffffffbc >> 0x10)), iVar5 != 0)))) {
      runpobj((runcxdef *)CONCAT44(uVar4,CONCAT22(uVar6,in_stack_ffffffffffffffd0)),
              (objnum)((ulong)voc_00 >> 0x30));
      return;
    }
  } while( true );
}

Assistant:

void bifnob(bifcxdef *ctx, int argc)
{
    objnum     prv;
    vocidef ***vpg;
    vocidef  **v;
    objnum     obj;
    int        i;
    int        j;
    objnum     cls;
    voccxdef  *voc = ctx->bifcxrun->runcxvoc;

    /* get last position in search */
    prv = runpopobj(ctx->bifcxrun);
    
    /* get class to search for, if one is specified */
    if (argc == 1)
        cls = MCMONINV;
    else if (argc == 2)
        cls = runpopobj(ctx->bifcxrun);
    else
        runsig(ctx->bifcxrun, ERR_BIFARGC);
    
    /* start at previous object plus 1 */
    i = (prv >> 8);
    vpg = voc->voccxinh + i;
    j = (prv & 255);
    obj = prv;
    v = (*vpg) + j;
    
    for (;;)
    {
        ++j;
        ++obj;
        ++v;
        if (j == 256)
        {
            j = 0;
            ++i;
            ++vpg;
            if (!*vpg)
            {
                obj += 255;
                j += 255;
                continue;
            }
            v = (*vpg);
        }
        if (i >= VOCINHMAX)
        {
            runpnil(ctx->bifcxrun);
            return;
        }
        
        if (!*v || ((*v)->vociflg & VOCIFCLASS)
            || (cls != MCMONINV && !bifinh(voc, *v, cls)))
            continue;
            
        /* this is an object we can use - push it */
        runpobj(ctx->bifcxrun, obj);
        return;
    }
}